

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedPtrField<google::protobuf::Message>::InternalSwap
          (RepeatedPtrField<google::protobuf::Message> *this,
          RepeatedPtrField<google::protobuf::Message> *other)

{
  RepeatedPtrField<google::protobuf::Message> *other_local;
  RepeatedPtrField<google::protobuf::Message> *this_local;
  
  internal::RepeatedPtrFieldBase::InternalSwap
            (&this->super_RepeatedPtrFieldBase,&other->super_RepeatedPtrFieldBase);
  return;
}

Assistant:

void InternalSwap(RepeatedPtrField* other) {
    internal::RepeatedPtrFieldBase::InternalSwap(other);
  }